

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

wchar_t curses_getpos(wchar_t *x,wchar_t *y,nh_bool force,char *goal)

{
  uint uVar1;
  curses_drawing_info *pcVar2;
  int iVar3;
  wchar_t wVar4;
  nh_direction nVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  __int32_t **pp_Var9;
  void *__ptr;
  short *psVar10;
  long lVar11;
  wchar_t wVar12;
  code *b;
  code *pcVar13;
  wchar_t wVar14;
  short *psVar15;
  wchar_t wVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  wchar_t wVar22;
  int iVar23;
  wchar_t wVar24;
  ulong uVar25;
  byte bVar26;
  bool bVar27;
  wchar_t my;
  wchar_t mx;
  char printbuf [256];
  nh_desc_buf descbuf;
  char *local_778;
  void *local_770;
  wchar_t local_760;
  undefined1 local_75c [12];
  code *local_750;
  wchar_t *local_748;
  wchar_t *local_740;
  char local_738 [260];
  wchar_t local_634 [64];
  wchar_t local_534 [64];
  wchar_t local_434 [64];
  wchar_t local_334 [64];
  wchar_t local_234 [64];
  wchar_t local_134 [65];
  
  iVar23 = 0x131fc0;
  werase(statuswin);
  iVar3 = wmove(statuswin,0,0);
  if (iVar3 != -1) {
    waddnstr(statuswin,"Select a target location with the cursor: \'.\' to confirm",0xffffffff);
  }
  pcVar17 = ".";
  if (force == '\0') {
    pcVar17 = ", ESC to cancel.";
  }
  waddnstr(statuswin,pcVar17,0xffffffff);
  iVar3 = wmove(statuswin,1,0);
  if (iVar3 != -1) {
    waddnstr(statuswin,"Press \'?\' for help and tips.",0xffffffff);
  }
  wrefresh(statuswin);
  wVar14 = *x;
  if (*x < L'\x01') {
    wVar14 = player.x;
  }
  wVar4 = *y;
  if (*y < L'\0') {
    wVar4 = player.y;
  }
  uVar25 = (ulong)(uint)wVar4;
  local_748 = x;
  local_740 = y;
  wmove(mapwin,uVar25,wVar14 + L'\xffffffff');
  b = (code *)"(\'?\' for help)";
  if (force == '\0') {
    b = (code *)"(ESC to abort, \'?\' for help)";
  }
  local_770 = (void *)0x0;
  __ptr = (void *)0x0;
  local_778 = "(ESC to abort, \'?\' for help)";
  bVar27 = false;
  local_750 = b;
  while( true ) {
    if (bVar27) {
      local_75c._0_2_ = 0;
      local_75c._2_2_ = 0;
      local_760 = L'\0';
      nh_describe_pos(wVar14,uVar25,local_634);
      werase(statuswin);
      place_desc_message((WINDOW *)local_75c,&local_760,local_134,(char *)b);
      place_desc_message((WINDOW *)local_75c,&local_760,local_234,(char *)b);
      place_desc_message((WINDOW *)local_75c,&local_760,local_334,(char *)b);
      place_desc_message((WINDOW *)local_75c,&local_760,local_434,(char *)b);
      place_desc_message((WINDOW *)local_75c,&local_760,local_534,(char *)b);
      place_desc_message((WINDOW *)local_75c,&local_760,local_634,(char *)b);
      wrefresh(statuswin);
      wmove(mapwin,uVar25,wVar14 + L'\xffffffff');
    }
    wVar4 = get_map_key(L'\0');
    if (wVar4 == L'\x1b') break;
    pvVar8 = memchr(" \r\n.,;:",(int)(char)wVar4,8);
    wVar12 = (wchar_t)uVar25;
    if (pvVar8 != (void *)0x0) {
      wVar4 = curses_getpos::pick_vals[(long)pvVar8 + -0x11a2c0];
LAB_0010c62f:
      *local_748 = wVar14;
      *local_740 = wVar12;
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (local_770 != (void *)0x0) {
        free(local_770);
      }
      curses_update_status((nh_player_info *)0x0);
      return wVar4;
    }
    nVar5 = key_to_dir(wVar4);
    if (nVar5 == DIR_NONE) {
      pp_Var9 = __ctype_tolower_loc();
      nVar5 = key_to_dir((*pp_Var9)[(uint)(wVar4 & 0xff)]);
      if (nVar5 == DIR_NONE) {
        uVar6 = 0;
        b = (code *)0x0;
      }
      else {
        b = (code *)(ulong)(uint)(xdir[nVar5] << 3);
        uVar6 = ydir[nVar5] << 3;
      }
    }
    else {
      b = (code *)(ulong)(uint)xdir[nVar5];
      uVar6 = ydir[nVar5];
    }
    pcVar2 = default_drawing;
    iVar3 = (int)b;
    if (iVar3 == 0 && uVar6 == 0) {
      if (wVar4 < L'M') {
        if (wVar4 == L'?') {
          b = (code *)0x0;
          curses_display_menu((nh_menuitem_conflict *)curses_getpos::helpitems,L'\x15',
                              "Targeting Help (default keys)",L'\0',(wchar_t *)0x0);
        }
        else {
          if (wVar4 != L'@') goto LAB_0010c3ad;
          uVar25 = (ulong)(uint)player.y;
          wVar14 = player.x;
        }
      }
      else if ((wVar4 == L'm') || (wVar4 == L'M')) {
        if (__ptr == (void *)0x0) {
          psVar10 = &(*display_buffer)[0].mon;
          uVar20 = 0;
          iVar23 = 0;
          do {
            lVar11 = 0;
            do {
              iVar23 = iVar23 + (uint)(((ulong)(uint)player.x * 0x18 != lVar11 ||
                                       uVar20 != (uint)player.y) &&
                                      *(short *)((long)psVar10 + lVar11) != 0);
              lVar11 = lVar11 + 0x18;
            } while (lVar11 != 0x780);
            uVar20 = uVar20 + 1;
            psVar10 = psVar10 + 0x3c0;
          } while (uVar20 != 0x15);
          __ptr = malloc((long)iVar23 * 8);
          uVar20 = (ulong)(uint)player.x;
          uVar19 = (ulong)(uint)player.y;
          psVar10 = &(*display_buffer)[0].mon;
          uVar18 = 0;
          iVar3 = 0;
          do {
            uVar21 = 0;
            psVar15 = psVar10;
            do {
              if ((*psVar15 != 0) && (uVar20 != uVar21 || uVar18 != uVar19)) {
                *(int *)((long)__ptr + (long)iVar3 * 8) = (int)uVar21;
                *(int *)((long)__ptr + (long)iVar3 * 8 + 4) = (int)uVar18;
                iVar3 = iVar3 + 1;
              }
              uVar21 = uVar21 + 1;
              psVar15 = psVar15 + 0xc;
            } while (uVar21 != 0x50);
            uVar18 = uVar18 + 1;
            psVar10 = psVar10 + 0x3c0;
          } while (uVar18 != 0x15);
          b = compare_coord_dist;
          qsort(__ptr,(long)iVar23,8,compare_coord_dist);
          local_778 = (char *)(ulong)((uint)(wVar4 != L'm') * 2 - 1);
        }
        if (iVar23 == 0) {
          iVar23 = 0;
        }
        else {
          iVar3 = (int)local_778;
          if (wVar4 == L'm') {
            local_778 = (char *)((long)(iVar3 + 1) % (long)iVar23 & 0xffffffff);
          }
          else {
            b = (code *)0x0;
            iVar7 = iVar23;
            if (0 < iVar3) {
              iVar7 = 0;
            }
            local_778 = (char *)(ulong)((iVar3 + iVar7) - 1);
          }
          wVar14 = *(wchar_t *)((long)__ptr + (long)(int)local_778 * 8);
          uVar25 = (ulong)*(uint *)((long)__ptr + (long)(int)local_778 * 8 + 4);
        }
      }
      else {
LAB_0010c3ad:
        wVar24 = default_drawing->num_bgelements;
        local_770 = malloc((long)wVar24);
        iVar3 = 0;
        bVar26 = false;
        memset(local_770,0,(long)wVar24);
        lVar11 = (long)pcVar2->bg_feature_offset;
        if (pcVar2->bg_feature_offset < pcVar2->num_bgelements) {
          b = (code *)(lVar11 * 0x28 + 0x24);
          do {
            if (wVar4 == *(short *)(b + (long)pcVar2->bgelements)) {
              iVar3 = iVar3 + 1;
              bVar26 = bVar26 + 1;
              *(byte *)((long)local_770 + lVar11) = bVar26;
            }
            lVar11 = lVar11 + 1;
            b = b + 0x28;
          } while (lVar11 < pcVar2->num_bgelements);
          bVar26 = iVar3 != 0;
        }
        if ((bool)(wVar4 != L'^' & (bVar26 ^ 1))) {
          sprintf(local_738,"Unknown targeting key %s.",local_750);
          curses_msgwin(local_738);
        }
        else {
          local_75c._4_8_ = &(*display_buffer)[0].trap;
          uVar6 = 0;
          do {
            wVar16 = wVar12;
            wVar24 = L'\0';
            if (uVar6 == 0) {
              wVar16 = L'\x14';
              wVar24 = wVar12;
            }
            if (wVar24 <= wVar16) {
              uVar19 = (ulong)wVar24;
              psVar10 = (short *)(local_75c._4_8_ + uVar19 * 0x3c0 * 2);
              uVar20 = uVar19;
              do {
                wVar24 = L'\x01';
                if (uVar20 == uVar19) {
                  wVar24 = wVar14 + L'\x01';
                }
                if (uVar6 != 0) {
                  wVar24 = L'\x01';
                }
                wVar22 = L'O';
                if (uVar20 == (long)wVar16) {
                  wVar22 = wVar14;
                }
                if (uVar6 != 1) {
                  wVar22 = L'O';
                }
                if (wVar24 <= wVar22) {
                  psVar15 = psVar10 + (long)wVar24 * 0xc;
                  do {
                    b = (code *)(long)psVar15[-1];
                    if (((b != (code *)0x0) && (*(code *)((long)local_770 + (long)b) != (code)0x0))
                       || ((wVar4 == L'^' && (*psVar15 != 0)))) {
                      uVar25 = uVar20 & 0xffffffff;
                      wVar14 = wVar24;
                      goto LAB_0010c5b6;
                    }
                    wVar24 = wVar24 + L'\x01';
                    psVar15 = psVar15 + 0xc;
                  } while (wVar22 + L'\x01' != wVar24);
                }
                uVar20 = uVar20 + 1;
                psVar10 = psVar10 + 0x3c0;
              } while (wVar16 + L'\x01' != (int)uVar20);
            }
            b = (code *)(ulong)(uVar6 + 1);
            bVar27 = uVar6 == 0;
            uVar6 = uVar6 + 1;
          } while (bVar27);
          sprintf(local_738,"Can\'t find dungeon feature \'%c\'.",(ulong)(uint)(int)(char)wVar4);
          curses_msgwin(local_738);
        }
      }
    }
    else {
      pcVar13 = (code *)(ulong)(uint)(1 - wVar14);
      if (iVar3 + wVar14 != 0 && SCARRY4(iVar3,wVar14) == iVar3 + wVar14 < 0) {
        pcVar13 = b;
      }
      iVar3 = 0x4f - wVar14;
      if ((int)pcVar13 + wVar14 < 0x50) {
        iVar3 = (int)pcVar13;
      }
      uVar1 = -wVar12;
      if (-1 < uVar6 + wVar12) {
        uVar1 = uVar6;
      }
      b = (code *)(ulong)uVar1;
      uVar6 = 0x14 - wVar12;
      if (uVar1 + wVar12 < 0x15) {
        uVar6 = uVar1;
      }
      uVar25 = (ulong)(uint)(uVar6 + wVar12);
      wVar14 = iVar3 + wVar14;
    }
LAB_0010c5b6:
    wmove(mapwin,uVar25,wVar14 + L'\xffffffff');
    wrefresh();
    bVar27 = true;
  }
  wVar4 = L'\xffffffff';
  wVar12 = L'\xfffffff6';
  wVar14 = L'\xfffffff6';
  goto LAB_0010c62f;
}

Assistant:

int curses_getpos(int *x, int *y, nh_bool force, const char *goal)
{
    int result = 0;
    int cx, cy;
    int key, dx, dy;
    int sidx;
    static const char pick_chars[] = " \r\n.,;:";
    static const int pick_vals[] = {1, 1, 1, 1, 2, 3, 4};
    const char *cp;
    char printbuf[BUFSZ];
    char *matching = NULL;
    enum nh_direction dir;
    struct coord *monpos = NULL;
    int moncount, monidx;
    nh_bool first_move = TRUE;

    werase(statuswin);
    mvwaddstr(statuswin, 0, 0, "Select a target location with the cursor: "
			       "'.' to confirm");
    if (!force) waddstr(statuswin, ", ESC to cancel.");
    else waddstr(statuswin, ".");
    mvwaddstr(statuswin, 1, 0, "Press '?' for help and tips.");
    wrefresh(statuswin);
    
    cx = *x >= 1 ? *x : player.x;
    cy = *y >= 0 ? *y : player.y;
    wmove(mapwin, cy, cx-1);
    
    while (1) {
	if (first_move) {
	    /* Give initial message a chance to be seen. */
	    first_move = FALSE;
	} else {
	    struct nh_desc_buf descbuf;
	    int mx = 0, my = 0;

	    /* Describe what's under the cursor in the status window. */
	    nh_describe_pos(cx, cy, &descbuf);

	    werase(statuswin);
	    place_desc_message(statuswin, &mx, &my, descbuf.effectdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.invisdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.mondesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.objdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.trapdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.bgdesc);
	    wrefresh(statuswin);

	    wmove(mapwin, cy, cx-1);
	}

	dx = dy = 0;
	key = get_map_key(FALSE);
	if (key == KEY_ESC) {
	    cx = cy = -10;
	    result = -1;
	    break;
	}
	
	if ((cp = strchr(pick_chars, (char)key)) != 0) {
	    result = pick_vals[cp - pick_chars];
	    break;
	}

	dir = key_to_dir(key);
	if (dir != DIR_NONE) {
	    dx = xdir[dir];
	    dy = ydir[dir];
	} else if ( (dir = key_to_dir(tolower((unsigned char)key))) != DIR_NONE ) {
	    /* a shifted movement letter */
	    dx = xdir[dir] * 8;
	    dy = ydir[dir] * 8;
	}
	
	if (dx || dy) {
	    /* truncate at map edge */
	    if (cx + dx < 1)
		dx = 1 - cx;
	    if (cx + dx > COLNO-1)
		dx = COLNO - 1 - cx;
	    if (cy + dy < 0)
		dy = -cy;
	    if (cy + dy > ROWNO-1)
		dy = ROWNO - 1 - cy;
	    cx += dx;
	    cy += dy;
	    goto nxtc;
	}

	if (key == 'm' || key == 'M') {
	    if (!monpos) {
		int i, j;
		moncount = 0;
		for (i = 0; i < ROWNO; i++)
		    for (j = 0; j < COLNO; j++)
			if (display_buffer[i][j].mon && (j != player.x || i != player.y))
			    moncount++;
		monpos = malloc(moncount * sizeof(struct coord));
		monidx = 0;
		for (i = 0; i < ROWNO; i++)
		    for (j = 0; j < COLNO; j++)
			if (display_buffer[i][j].mon && (j != player.x || i != player.y)) {
			    monpos[monidx].x = j;
			    monpos[monidx].y = i;
			    monidx++;
			}
		qsort(monpos, moncount, sizeof(struct coord), compare_coord_dist);
		/* ready this for first increment/decrement to change to zero */
		monidx = (key == 'm') ? -1 : 1;
	    }
	    
	    if (moncount) { /* there is at least one monster to move to */
		if (key == 'm') {
		    monidx = (monidx + 1) % moncount;
		} else {
		    monidx--;
		    if (monidx < 0) monidx += moncount;
		}
		cx = monpos[monidx].x;
		cy = monpos[monidx].y;
	    }
	} else if (key == '@') {
	    cx = player.x;
	    cy = player.y;
	} else if (key == '?') {
	    static struct nh_menuitem helpitems[] = {
		{0, MI_TEXT, "Move the cursor with the direction keys:"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "7 8 9   y k u"},
		{0, MI_TEXT, " \\|/     \\|/"},
		{0, MI_TEXT, "4- -6   h- -l"},
		{0, MI_TEXT, " /|\\     /|\\"},
		{0, MI_TEXT, "1 2 3   b j n"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "Hold shift to move the cursor further."},
		{0, MI_TEXT, "Confirm your chosen location with one of .,;:"},
		{0, MI_TEXT, "Cancel with ESC (not always possible)."},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "Targeting shortcuts:"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "@    self"},
		{0, MI_TEXT, "m/M  next/previous monster"},
		{0, MI_TEXT, "<    upstairs"},
		{0, MI_TEXT, ">    downstairs"},
		{0, MI_TEXT, "_    altar"},
		{0, MI_TEXT, "#    sink"},
		{0, MI_TEXT, "     (other dungeon symbols also work)"},
	    };
	    curses_display_menu(helpitems, ARRAY_SIZE(helpitems),
				"Targeting Help (default keys)",
				PICK_NONE, NULL);
	} else {
	    int k = 0, tx, ty;
	    int pass, lo_x, lo_y, hi_x, hi_y;
	    matching = malloc(default_drawing->num_bgelements);
	    memset(matching, 0, default_drawing->num_bgelements);
	    for (sidx = default_drawing->bg_feature_offset;
		 sidx < default_drawing->num_bgelements; sidx++)
		if (key == default_drawing->bgelements[sidx].ch)
		    matching[sidx] = (char) ++k;
	    if (k || key == '^') {
		for (pass = 0; pass <= 1; pass++) {
		    /* pass 0: just past current pos to lower right;
			pass 1: upper left corner to current pos */
		    lo_y = (pass == 0) ? cy : 0;
		    hi_y = (pass == 0) ? ROWNO - 1 : cy;
		    for (ty = lo_y; ty <= hi_y; ty++) {
			lo_x = (pass == 0 && ty == lo_y) ? cx + 1 : 1;
			hi_x = (pass == 1 && ty == hi_y) ? cx : COLNO - 1;
			for (tx = lo_x; tx <= hi_x; tx++) {
			    k = display_buffer[ty][tx].bg;
			    if ((k && matching[k]) ||
				(key == '^' && display_buffer[ty][tx].trap)) {
				cx = tx;
				cy = ty;
				goto nxtc;
			    }
			}	/* column */
		    }	/* row */
		}		/* pass */
		sprintf(printbuf, "Can't find dungeon feature '%c'.", (char)key);
		curses_msgwin(printbuf);
	    } else {
		sprintf(printbuf, "Unknown targeting key %s.",
			!force ? "(ESC to abort, '?' for help)" : "('?' for help)");
		curses_msgwin(printbuf);
	    }
	}

nxtc:
	wmove(mapwin, cy, cx-1);
	wrefresh(mapwin);
    }
    
    *x = cx;
    *y = cy;
    if (monpos)
	free(monpos);
    if (matching)
	free(matching);
    curses_update_status(NULL); /* clear the help message */
    return result;
}